

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder1<std::_Bind<void(*(std::shared_ptr<nuraft::delayed_task>,std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>&,std::error_code)>,std::error_code>,std::_Bind<void(*(std::shared_ptr<nuraft::delayed_task>,std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>&,std::error_code)>>
               (binder1<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_std::error_code>
                *function,
               _Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>
               *context)

{
  undefined8 in_RSI;
  binder1<std::_Bind<void_(*(std::shared_ptr<nuraft::delayed_task>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>_&,_std::error_code)>,_std::error_code>
  *in_RDI;
  
  asio::
  asio_handler_invoke<asio::detail::binder1<std::_Bind<void(*(std::shared_ptr<nuraft::delayed_task>,std::_Placeholder<1>))(std::shared_ptr<nuraft::delayed_task>&,std::error_code)>,std::error_code>>
            (in_RDI,in_RSI);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#elif defined(ASIO_NO_DEPRECATED)
  // The asio_handler_invoke hook is no longer used to invoke the function.
  (void)&error_if_hook_is_defined<Function, Context>;
  (void)context;
  function();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}